

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

U32 ZSTD_finalizeOffCode(U32 rawOffset,U32 *rep,U32 ll0)

{
  int local_24;
  U32 local_20;
  U32 repCode;
  U32 offCode;
  U32 ll0_local;
  U32 *rep_local;
  U32 rawOffset_local;
  
  local_20 = rawOffset + 2;
  local_24 = 0;
  if ((ll0 == 0) && (rawOffset == *rep)) {
    local_24 = 1;
  }
  else if (rawOffset == rep[1]) {
    local_24 = 2 - ll0;
  }
  else if (rawOffset == rep[2]) {
    local_24 = 3 - ll0;
  }
  else if ((ll0 != 0) && (rawOffset == *rep - 1)) {
    local_24 = 3;
  }
  if (local_24 != 0) {
    local_20 = local_24 - 1;
  }
  return local_20;
}

Assistant:

static U32 ZSTD_finalizeOffCode(U32 rawOffset, const U32 rep[ZSTD_REP_NUM], U32 ll0) {
    U32 offCode = rawOffset + ZSTD_REP_MOVE;
    U32 repCode = 0;

    if (!ll0 && rawOffset == rep[0]) {
        repCode = 1;
    } else if (rawOffset == rep[1]) {
        repCode = 2 - ll0;
    } else if (rawOffset == rep[2]) {
        repCode = 3 - ll0;
    } else if (ll0 && rawOffset == rep[0] - 1) {
        repCode = 3;
    }
    if (repCode) {
        /* ZSTD_storeSeq expects a number in the range [0, 2] to represent a repcode */
        offCode = repCode - 1;
    }
    return offCode;
}